

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * Catch::(anonymous_namespace)::formatDuration_abi_cxx11_(double seconds)

{
  _Setprecision _Var1;
  ReusableStringStream *this;
  string *in_RDI;
  ReusableStringStream rss;
  ReusableStringStream *in_stack_ffffffffffffff98;
  ReusableStringStream *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  string *this_00;
  ReusableStringStream *in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffa0);
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffffa0,(_func_ios_base_ptr_ios_base_ptr *)in_stack_ffffffffffffff98)
  ;
  _Var1 = std::setprecision(3);
  this = ReusableStringStream::operator<<
                   ((ReusableStringStream *)this_00,
                    (_Setprecision *)CONCAT44(_Var1._M_n,in_stack_ffffffffffffffa8));
  ReusableStringStream::operator<<(this,(double *)in_stack_ffffffffffffff98);
  ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff98);
  ReusableStringStream::~ReusableStringStream(in_stack_ffffffffffffffe0);
  return in_RDI;
}

Assistant:

std::string formatDuration( double seconds ) {
            ReusableStringStream rss;
            rss << std::fixed << std::setprecision( 3 ) << seconds;
            return rss.str();
        }